

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkSetSmallNumEFails(void *arkode_mem,int small_nef)

{
  int in_ESI;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  int retval;
  ARKodeMem *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = arkAccessHAdaptMem((void *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                               in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                               (ARKodeHAdaptMem *)0xeace66);
  if (local_4 == 0) {
    if (in_ESI < 1) {
      in_stack_ffffffffffffffe0[0x20] = '\x02';
      in_stack_ffffffffffffffe0[0x21] = '\0';
      in_stack_ffffffffffffffe0[0x22] = '\0';
      in_stack_ffffffffffffffe0[0x23] = '\0';
    }
    else {
      *(int *)(in_stack_ffffffffffffffe0 + 0x20) = in_ESI;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkSetSmallNumEFails(void *arkode_mem, int small_nef)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, "arkSetSmallNumEFails",
                              &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* if argument legal set it, otherwise set default */
  if (small_nef <= 0) {
    hadapt_mem->small_nef = SMALL_NEF;
  } else {
    hadapt_mem->small_nef = small_nef;
  }

  return(ARK_SUCCESS);
}